

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

void __thiscall llvm::SourceMgr::PrintIncludeStack(SourceMgr *this,SMLoc IncludeLoc,raw_ostream *OS)

{
  uint i;
  SrcBuffer *pSVar1;
  raw_ostream *prVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  StringRef SVar4;
  StringRef Str;
  StringRef Str_00;
  
  if (IncludeLoc.Ptr == (char *)0x0) {
    return;
  }
  i = FindBufferContainingLoc(this,IncludeLoc);
  if (i != 0) {
    pSVar1 = getBufferInfo(this,i);
    PrintIncludeStack(this,(SMLoc)(pSVar1->IncludeLoc).Ptr,OS);
    SVar4.Length = 0xe;
    SVar4.Data = "Included from ";
    prVar2 = raw_ostream::operator<<(OS,SVar4);
    pSVar1 = getBufferInfo(this,i);
    SVar4 = (StringRef)
            (**(code **)((long)((pSVar1->Buffer)._M_t.
                                super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
                                .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl)->
                               _vptr_MemoryBuffer + 0x10))();
    prVar2 = raw_ostream::operator<<(prVar2,SVar4);
    Str.Length = 1;
    Str.Data = ":";
    prVar2 = raw_ostream::operator<<(prVar2,Str);
    pVar3 = getLineAndColumn(this,IncludeLoc,i);
    prVar2 = raw_ostream::operator<<(prVar2,(ulong)pVar3 & 0xffffffff);
    Str_00.Length = 2;
    Str_00.Data = ":\n";
    raw_ostream::operator<<(prVar2,Str_00);
    return;
  }
  __assert_fail("CurBuf && \"Invalid or unspecified location!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/SourceMgr.cpp"
                ,0x9a,"void llvm::SourceMgr::PrintIncludeStack(SMLoc, raw_ostream &) const");
}

Assistant:

void SourceMgr::PrintIncludeStack(SMLoc IncludeLoc, raw_ostream &OS) const {
  if (IncludeLoc == SMLoc()) return;  // Top of stack.

  unsigned CurBuf = FindBufferContainingLoc(IncludeLoc);
  assert(CurBuf && "Invalid or unspecified location!");

  PrintIncludeStack(getBufferInfo(CurBuf).IncludeLoc, OS);

  OS << "Included from "
     << getBufferInfo(CurBuf).Buffer->getBufferIdentifier()
     << ":" << FindLineNumber(IncludeLoc, CurBuf) << ":\n";
}